

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_153ab3::TemplateArgs::printLeft(TemplateArgs *this,OutputStream *S)

{
  char cVar1;
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  TemplateArgs *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28,"<");
  OutputStream::operator+=(local_18,local_28);
  NodeArray::printWithComma(&this->Params,local_18);
  cVar1 = OutputStream::back(local_18);
  if (cVar1 == '>') {
    StringView::StringView(&local_38," ");
    OutputStream::operator+=(local_18,local_38);
  }
  StringView::StringView(&local_48,">");
  OutputStream::operator+=(local_18,local_48);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "<";
    Params.printWithComma(S);
    if (S.back() == '>')
      S += " ";
    S += ">";
  }